

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void print_string(flatcc_json_printer_t *ctx,char *s,size_t n)

{
  char *pcVar1;
  size_t n_00;
  bool bVar2;
  size_t k;
  byte *pbStack_28;
  uchar c;
  char *p;
  size_t n_local;
  char *s_local;
  flatcc_json_printer_t *ctx_local;
  
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '\"';
  pbStack_28 = (byte *)s;
  p = (char *)n;
  n_local = (size_t)s;
  while( true ) {
    k._7_1_ = *pbStack_28;
    while( true ) {
      bVar2 = false;
      if ((0x1f < k._7_1_) && (bVar2 = false, k._7_1_ != 0x22)) {
        bVar2 = k._7_1_ != 0x5c;
      }
      if (!bVar2) break;
      k._7_1_ = pbStack_28[1];
      pbStack_28 = pbStack_28 + 1;
    }
    n_00 = (long)pbStack_28 - n_local;
    print(ctx,(char *)n_local,n_00);
    if ((long)p - n_00 == 0) break;
    print_escape(ctx,k._7_1_);
    pbStack_28 = pbStack_28 + 1;
    p = (char *)(((long)p - n_00) + -1);
    n_local = n_00 + n_local + 1;
  }
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '\"';
  return;
}

Assistant:

static void print_string(flatcc_json_printer_t *ctx, const char *s, size_t n)
{
    const char *p = s;
    /* Unsigned is important. */
    unsigned char c;
    size_t k;

    print_char('\"');
    for (;;) {
        c = (unsigned char)*p;
        while (c >= 0x20 && c != '\"' && c != '\\') {
            c = (unsigned char)*++p;
        }
        k = (size_t)(p - s);
        /* Even if k == 0, print ensures buffer flush. */
        print(ctx, s, k);
        n -= k;
        if (n == 0) break;
        s += k;
        print_escape(ctx, c);
        ++p;
        --n;
        ++s;
    }
    print_char('\"');
}